

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

uint __thiscall llvm::APInt::countLeadingOnesSlowCase(APInt *this)

{
  long lVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar7 = this->BitWidth & 0x3f;
  bVar3 = 0x40 - (char)uVar7;
  uVar5 = (ulong)this->BitWidth + 0x3f >> 6;
  uVar6 = 0x40;
  if (uVar7 != 0) {
    uVar6 = uVar7;
  }
  if (uVar7 == 0) {
    bVar3 = 0;
  }
  uVar2 = (this->U).pVal[uVar5 - 1] << (bVar3 & 0x3f) ^ 0xffffffffffffffff;
  if (uVar2 == 0) {
    uVar7 = 0x40;
  }
  else {
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar7 = (uint)lVar1 ^ 0x3f;
  }
  if (uVar6 == uVar7) {
    uVar7 = uVar6;
    for (uVar4 = (int)uVar5 - 2; -1 < (int)uVar4; uVar4 = uVar4 - 1) {
      uVar5 = (this->U).pVal[uVar4];
      if (uVar5 != 0xffffffffffffffff) {
        uVar5 = ~uVar5;
        lVar1 = 0x3f;
        if (uVar5 != 0) {
          for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        return ((uint)lVar1 ^ 0x3f) + uVar7;
      }
      uVar7 = uVar7 + 0x40;
    }
  }
  return uVar7;
}

Assistant:

unsigned APInt::countLeadingOnesSlowCase() const {
  unsigned highWordBits = BitWidth % APINT_BITS_PER_WORD;
  unsigned shift;
  if (!highWordBits) {
    highWordBits = APINT_BITS_PER_WORD;
    shift = 0;
  } else {
    shift = APINT_BITS_PER_WORD - highWordBits;
  }
  int i = getNumWords() - 1;
  unsigned Count = llvm::countLeadingOnes(U.pVal[i] << shift);
  if (Count == highWordBits) {
    for (i--; i >= 0; --i) {
      if (U.pVal[i] == WORD_MAX)
        Count += APINT_BITS_PER_WORD;
      else {
        Count += llvm::countLeadingOnes(U.pVal[i]);
        break;
      }
    }
  }
  return Count;
}